

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

db_bit * __thiscall lan::db::find(db *this,string *name,db_bit *ref)

{
  bool bVar1;
  __type _Var2;
  out_of_range *this_00;
  allocator<char> local_71;
  string local_70;
  string local_50;
  db_bit *local_30;
  db_bit *buf;
  db_bit *ref_local;
  string *name_local;
  db *this_local;
  
  local_30 = ref;
  buf = ref;
  ref_local = (db_bit *)name;
  name_local = (string *)this;
  bVar1 = std::operator==(name,"@");
  if (bVar1) {
    this_local = (db *)this->anchor;
  }
  else {
    bVar1 = std::operator==(name,"@");
    if (bVar1) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
      error_string(&local_50,this,_empty_anchor_error,&local_70);
      std::out_of_range::out_of_range(this_00,(string *)&local_50);
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    for (; local_30 != (db_bit *)0x0; local_30 = local_30->nex) {
      _Var2 = std::operator==(&local_30->key,name);
      if (_Var2) {
        return local_30;
      }
    }
    this_local = (db *)0x0;
  }
  return (db_bit *)this_local;
}

Assistant:

lan::db_bit * db::find(const std::string name, lan::db_bit * ref){
            lan::db_bit * buf = ref;
            if(name == "@") return anchor;
            else if(name == "@") throw lan::errors::anchor_name_error(error_string(errors::_private::_empty_anchor_error, ""));
            while (buf) {
                if(buf->key == name) return buf;
                buf = buf->nex;
            } return nullptr;
        }